

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolitaireTests.cpp
# Opt level: O0

void __thiscall
solitaire::SolitaireHandWithOneCardTest_ignoreSomeOperationsIfGameFinished_Test::TestBody
          (SolitaireHandWithOneCardTest_ignoreSomeOperationsIfGameFinished_Test *this)

{
  FoundationPileMock *this_00;
  TableauPileMock *this_01;
  StrictMock<solitaire::archivers::MoveCardsOperationSnapshotCreatorMock> *__return_storage_ptr__;
  MockSpec<void_()> *this_02;
  TypedExpectation<void_()> *this_03;
  MockSpec<void_(std::optional<solitaire::cards::Card>_&)> *this_04;
  TypedExpectation<void_(std::optional<solitaire::cards::Card>_&)> *this_05;
  MockSpec<void_(std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&)>
  *this_06;
  TypedExpectation<void_(std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&)>
  *this_07;
  MoveCardsOperationSnapshotCreatorMock *in_RSI;
  PileId local_b4;
  PileId local_b0;
  WithoutMatchers local_a9;
  Matcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&> local_a8;
  MockSpec<void_(std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&)>
  local_90;
  WithoutMatchers local_6d [13];
  Matcher<std::optional<solitaire::cards::Card>_&> local_60;
  MockSpec<void_(std::optional<solitaire::cards::Card>_&)> local_48;
  WithoutMatchers local_21;
  MockSpec<void_()> local_20;
  SolitaireHandWithOneCardTest_ignoreSomeOperationsIfGameFinished_Test *local_10;
  SolitaireHandWithOneCardTest_ignoreSomeOperationsIfGameFinished_Test *this_local;
  
  local_10 = this;
  SolitaireEmptyHandTest::finishGame((SolitaireEmptyHandTest *)this);
  __return_storage_ptr__ =
       mock_ptr<testing::StrictMock<solitaire::archivers::MoveCardsOperationSnapshotCreatorMock>_>::
       operator*(&(this->super_SolitaireHandWithOneCardTest).super_SolitaireEmptyHandTest.
                  super_SolitaireTest.moveCardsOperationSnapshotCreatorMock);
  local_20.function_mocker_ =
       (FunctionMocker<void_()> *)
       archivers::MoveCardsOperationSnapshotCreatorMock::gmock_restoreSourcePile
                 ((MockSpec<void_()> *)__return_storage_ptr__,in_RSI);
  testing::internal::GetWithoutMatchers();
  this_02 = testing::internal::MockSpec<void_()>::operator()(&local_20,&local_21,(void *)0x0);
  this_03 = testing::internal::MockSpec<void_()>::InternalExpectedAt
                      (this_02,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                       ,0x1c2,"*moveCardsOperationSnapshotCreatorMock","restoreSourcePile()");
  testing::internal::TypedExpectation<void_()>::Times(this_03,0);
  this_00 = (this->super_SolitaireHandWithOneCardTest).super_SolitaireEmptyHandTest.
            super_SolitaireTest.lastFoundationPileMock;
  testing::Matcher<std::optional<solitaire::cards::Card>&>::
  Matcher<testing::internal::AnythingMatcher_const&,void>
            ((Matcher<std::optional<solitaire::cards::Card>&> *)&local_60,
             (AnythingMatcher *)&testing::_);
  piles::FoundationPileMock::gmock_tryAddCard(&local_48,this_00,&local_60);
  testing::internal::GetWithoutMatchers();
  this_04 = testing::internal::MockSpec<void_(std::optional<solitaire::cards::Card>_&)>::operator()
                      (&local_48,local_6d,(void *)0x0);
  this_05 = testing::internal::MockSpec<void_(std::optional<solitaire::cards::Card>_&)>::
            InternalExpectedAt(this_04,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                               ,0x1c3,"lastFoundationPileMock","tryAddCard(_)");
  testing::internal::TypedExpectation<void_(std::optional<solitaire::cards::Card>_&)>::Times
            (this_05,0);
  testing::internal::MockSpec<void_(std::optional<solitaire::cards::Card>_&)>::~MockSpec(&local_48);
  testing::Matcher<std::optional<solitaire::cards::Card>_&>::~Matcher(&local_60);
  this_01 = (this->super_SolitaireHandWithOneCardTest).super_SolitaireEmptyHandTest.
            super_SolitaireTest.lastTableauPileMock;
  testing::Matcher<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>&>::
  Matcher<testing::internal::AnythingMatcher_const&,void>
            ((Matcher<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>&> *
             )&local_a8,(AnythingMatcher *)&testing::_);
  piles::TableauPileMock::gmock_tryAddCards(&local_90,this_01,&local_a8);
  testing::internal::GetWithoutMatchers();
  this_06 = testing::internal::
            MockSpec<void_(std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&)>
            ::operator()(&local_90,&local_a9,(void *)0x0);
  this_07 = testing::internal::
            MockSpec<void_(std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&)>
            ::InternalExpectedAt
                      (this_06,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                       ,0x1c4,"lastTableauPileMock","tryAddCards(_)");
  testing::internal::
  TypedExpectation<void_(std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&)>
  ::Times(this_07,0);
  testing::internal::
  MockSpec<void_(std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&)>::
  ~MockSpec(&local_90);
  testing::Matcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&>::
  ~Matcher(&local_a8);
  Solitaire::tryPutCardsBackFromHand
            (&(this->super_SolitaireHandWithOneCardTest).super_SolitaireEmptyHandTest.
              super_SolitaireTest.solitaire);
  piles::PileId::PileId(&local_b0,(PileId *)&(anonymous_namespace)::lastFoundationPileId);
  Solitaire::tryAddCardOnFoundationPile
            (&(this->super_SolitaireHandWithOneCardTest).super_SolitaireEmptyHandTest.
              super_SolitaireTest.solitaire,&local_b0);
  piles::PileId::PileId(&local_b4,(PileId *)&(anonymous_namespace)::lastTableauPileId);
  Solitaire::tryAddCardsOnTableauPile
            (&(this->super_SolitaireHandWithOneCardTest).super_SolitaireEmptyHandTest.
              super_SolitaireTest.solitaire,&local_b4);
  return;
}

Assistant:

TEST_F(SolitaireHandWithOneCardTest, ignoreSomeOperationsIfGameFinished) {
    finishGame();

    EXPECT_CALL(*moveCardsOperationSnapshotCreatorMock, restoreSourcePile()).Times(0);
    EXPECT_CALL(lastFoundationPileMock, tryAddCard(_)).Times(0);
    EXPECT_CALL(lastTableauPileMock, tryAddCards(_)).Times(0);

    solitaire.tryPutCardsBackFromHand();
    solitaire.tryAddCardOnFoundationPile(lastFoundationPileId);
    solitaire.tryAddCardsOnTableauPile(lastTableauPileId);
}